

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

void __thiscall
Js::AsmJsFunc::AsmJsFunc
          (AsmJsFunc *this,PropertyName name,ParseNodeFnc *pnodeFnc,ArenaAllocator *allocator,
          ScriptContext *scriptContext)

{
  AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
            (&this->super_AsmJsFunctionDeclaration,name,ModuleFunction,allocator);
  (this->super_AsmJsFunctionDeclaration).super_AsmJsSymbol._vptr_AsmJsSymbol =
       (_func_int **)&PTR_GetType_01385bd8;
  this->mCompileTime = 0;
  JsUtil::
  BaseDictionary<int,_Js::AsmJsVarBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->mVarMap,allocator,0);
  this->mBodyNode = (ParseNode *)0x0;
  this->mFncNode = pnodeFnc;
  WAsmJs::TypedRegisterAllocator::TypedRegisterAllocator
            (&this->mTypedRegisterAllocator,allocator,AllocateRegisterSpace,0x10);
  this->mFuncInfo = pnodeFnc->funcInfo;
  this->mFuncBody = (FunctionBody *)0x0;
  this->mMaxArgOutDepth = 0;
  this->mCurrentProfileId = 0;
  this->field_0xd3 = this->field_0xd3 & 0xfe;
  return;
}

Assistant:

AsmJsFunc::AsmJsFunc(PropertyName name, ParseNodeFnc* pnodeFnc, ArenaAllocator* allocator, ScriptContext* scriptContext) :
        AsmJsFunctionDeclaration(name, AsmJsSymbol::ModuleFunction, allocator)
        , mCompileTime(0)
        , mVarMap(allocator)
        , mBodyNode(nullptr)
        , mFncNode(pnodeFnc)
        , mCurrentProfileId(0)
        , mTypedRegisterAllocator(
            allocator,
            AllocateRegisterSpace,
            1 << WAsmJs::SIMD
#if TARGET_32
            | 1 << WAsmJs::INT64
#endif
        )
        , mFuncInfo(pnodeFnc->funcInfo)
        , mFuncBody(nullptr)
        , mMaxArgOutDepth(0)
        , mDefined( false )
    {
    }